

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_dictionary.cc
# Opt level: O3

void LabelDict::free_label_features(label_feature_map *lfm)

{
  float *__ptr;
  unsigned_long *__ptr_00;
  hash_elem *phVar1;
  hash_elem *__s;
  hash_elem *phVar2;
  
  __s = (lfm->dat)._begin;
  phVar1 = (lfm->dat).end_array;
  phVar2 = __s;
  do {
    if (phVar2 == phVar1) {
LAB_002725a8:
      if (lfm->num_occupants != 0) {
        memset(__s,0,(long)phVar1 - (long)__s);
        lfm->last_position = 0;
        lfm->num_occupants = 0;
        __s = (lfm->dat)._begin;
      }
      if (__s != (hash_elem *)0x0) {
        free(__s);
      }
      (lfm->dat)._begin = (hash_elem *)0x0;
      (lfm->dat)._end = (hash_elem *)0x0;
      (lfm->dat).end_array = (hash_elem *)0x0;
      return;
    }
    if (phVar2->occupied == true) {
      do {
        __ptr = (phVar2->val).values._begin;
        if (__ptr != (float *)0x0) {
          free(__ptr);
        }
        (phVar2->val).values._begin = (float *)0x0;
        (phVar2->val).values._end = (float *)0x0;
        (phVar2->val).values.end_array = (float *)0x0;
        __ptr_00 = (phVar2->val).indicies._begin;
        if (__ptr_00 != (unsigned_long *)0x0) {
          free(__ptr_00);
        }
        (phVar2->val).indicies._begin = (unsigned_long *)0x0;
        (phVar2->val).indicies._end = (unsigned_long *)0x0;
        (phVar2->val).indicies.end_array = (unsigned_long *)0x0;
        v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::delete_v(&(phVar2->val).space_names);
        phVar1 = (lfm->dat).end_array;
        do {
          phVar2 = phVar2 + 1;
          if (phVar2 == phVar1) {
            __s = (lfm->dat)._begin;
            goto LAB_002725a8;
          }
        } while (phVar2->occupied != true);
      } while( true );
    }
    phVar2 = phVar2 + 1;
  } while( true );
}

Assistant:

void free_label_features(label_feature_map& lfm)
{
  void* label_iter = lfm.iterator();
  while (label_iter != nullptr)
  {
    features* res = lfm.iterator_get_value(label_iter);
    res->values.delete_v();
    res->indicies.delete_v();
    res->space_names.delete_v();

    label_iter = lfm.iterator_next(label_iter);
  }
  lfm.clear();
  lfm.delete_v();
}